

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O0

ON_SubD_ComponentIdTypeAndTag ON_SubD_ComponentIdTypeAndTag::CreateFromEdge(ON_SubDEdgePtr eptr)

{
  ON_SubDEdgeTag OVar1;
  ON_SubDEdge *e;
  ON__UINT_PTR OVar2;
  ON_SubDEdgePtr local_20;
  ON_SubDEdgePtr eptr_local;
  ON_SubD_ComponentIdTypeAndTag itt;
  
  local_20.m_ptr = eptr.m_ptr;
  e = ON_SubDEdgePtr::Edge(&local_20);
  _eptr_local = CreateFromEdge(e);
  OVar1 = EdgeTag((ON_SubD_ComponentIdTypeAndTag *)&eptr_local);
  if (OVar1 != Unset) {
    OVar2 = ON_SubDEdgePtr::EdgeDirection(&local_20);
    Internal_SetDir((ON_SubD_ComponentIdTypeAndTag *)&eptr_local,OVar2 != 0);
  }
  return _eptr_local;
}

Assistant:

const ON_SubD_ComponentIdTypeAndTag ON_SubD_ComponentIdTypeAndTag::CreateFromEdge(const class ON_SubDEdgePtr eptr)
{
  ON_SubD_ComponentIdTypeAndTag itt = ON_SubD_ComponentIdTypeAndTag::CreateFromEdge(eptr.Edge());
  if (ON_SubDEdgeTag::Unset != itt.EdgeTag())
    itt.Internal_SetDir(0 == eptr.EdgeDirection() ? 0 : 1);
  return itt;
}